

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

_anonymous_namespace_ * __thiscall
pugi::impl::(anonymous_namespace)::as_utf8_impl_abi_cxx11_
          (_anonymous_namespace_ *this,wchar_t *str,size_t length)

{
  size_t size_00;
  char *buffer;
  size_t size;
  size_t length_local;
  wchar_t *str_local;
  string *result;
  
  size_00 = anon_unknown_0::as_utf8_begin(str,length);
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::resize((ulong)this);
  if (size_00 != 0) {
    buffer = (char *)std::__cxx11::string::operator[]((ulong)this);
    anon_unknown_0::as_utf8_end(buffer,size_00,str,length);
  }
  return this;
}

Assistant:

PUGI__FN std::string as_utf8_impl(const wchar_t* str, size_t length)
	{
		// first pass: get length in utf8 characters
		size_t size = as_utf8_begin(str, length);

		// allocate resulting string
		std::string result;
		result.resize(size);

		// second pass: convert to utf8
		if (size > 0) as_utf8_end(&result[0], size, str, length);

		return result;
	}